

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall
ConnmanTestMsg::ReceiveMsgFrom(ConnmanTestMsg *this,CNode *node,CSerializedNetMsg *ser_msg)

{
  Span<const_unsigned_char> msg_bytes;
  bool bVar1;
  uint uVar2;
  pointer pTVar3;
  __tuple_element_t<0UL,_tuple<Span<const_unsigned_char>,_bool,_const_basic_string<char,_char_traits<char>,_allocator<char>_>_&>_>
  *p_Var4;
  size_t sVar5;
  undefined8 in_RDX;
  ConnmanTestMsg *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *_msg_type;
  type *_more;
  type *to_send;
  bool queued;
  bool complete;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  CNode *in_stack_ffffffffffffff70;
  undefined1 *puVar6;
  undefined1 local_30 [39];
  byte local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar3 = std::unique_ptr<Transport,_std::default_delete<Transport>_>::operator->
                     ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
                      CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  uVar2 = (*pTVar3->_vptr_Transport[6])(pTVar3,in_RDX);
  if ((uVar2 & 1) == 0) {
    __assert_fail("queued",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/net.cpp"
                  ,0x5e,"bool ConnmanTestMsg::ReceiveMsgFrom(CNode &, CSerializedNetMsg &&) const");
  }
  local_9 = 0;
  while( true ) {
    pTVar3 = std::unique_ptr<Transport,_std::default_delete<Transport>_>::operator->
                       ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
                        CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    (*pTVar3->_vptr_Transport[7])(local_30,pTVar3,0);
    puVar6 = local_30;
    p_Var4 = std::get<0ul,Span<unsigned_char_const>,bool,std::__cxx11::string_const&>
                       ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                         *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    std::get<1ul,Span<unsigned_char_const>,bool,std::__cxx11::string_const&>
              ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    std::get<2ul,Span<unsigned_char_const>,bool,std::__cxx11::string_const&>
              ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    bVar1 = Span<const_unsigned_char>::empty
                      ((Span<const_unsigned_char> *)
                       CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    if (bVar1) break;
    msg_bytes.m_size = (size_t)puVar6;
    msg_bytes.m_data = (uchar *)p_Var4;
    NodeReceiveMsgBytes(in_RDI,in_stack_ffffffffffffff70,msg_bytes,
                        (bool *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    in_stack_ffffffffffffff70 =
         (CNode *)std::unique_ptr<Transport,_std::default_delete<Transport>_>::operator->
                            ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
                             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    sVar5 = Span<const_unsigned_char>::size
                      ((Span<const_unsigned_char> *)
                       CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    (*(code *)(in_stack_ffffffffffffff70->m_transport)._M_t.
              super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
              super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
              super__Head_base<0UL,_Transport_*,_false>._M_head_impl[8]._vptr_Transport)
              (in_stack_ffffffffffffff70,sVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_9 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool ConnmanTestMsg::ReceiveMsgFrom(CNode& node, CSerializedNetMsg&& ser_msg) const
{
    bool queued = node.m_transport->SetMessageToSend(ser_msg);
    assert(queued);
    bool complete{false};
    while (true) {
        const auto& [to_send, _more, _msg_type] = node.m_transport->GetBytesToSend(false);
        if (to_send.empty()) break;
        NodeReceiveMsgBytes(node, to_send, complete);
        node.m_transport->MarkBytesSent(to_send.size());
    }
    return complete;
}